

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3MsrIncrNext
              (Fts3Table *p,Fts3MultiSegReader *pMsr,sqlite3_int64 *piDocid,char **paPoslist,
              int *pnPoslist)

{
  long lVar1;
  Fts3Table *in_RCX;
  undefined8 *in_RSI;
  Fts3SegReader *in_R8;
  long in_FS_OFFSET;
  bool bVar2;
  sqlite3_int64 iDocid;
  int j;
  int rc;
  Fts3SegReader *pSeg;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *xCmp;
  Fts3SegReader **apSegment;
  int nMerge;
  int nList;
  char *pList;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *xCmp_00;
  int nSuspect;
  Fts3SegReader **apSegment_00;
  long *pnOffsetList;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  int local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = *(int *)((long)in_RSI + 0xc);
  pnOffsetList = (long *)*in_RSI;
  if (iVar3 == 0) {
    (in_RCX->base).pModule = (sqlite3_module *)0x0;
    local_18 = 0;
  }
  else {
    while (apSegment_00 = *(Fts3SegReader ***)*in_RSI, apSegment_00[0xe] != (Fts3SegReader *)0x0) {
      xCmp_00 = *(_func_int_Fts3SegReader_ptr_Fts3SegReader_ptr **)(*pnOffsetList + 0x80);
      local_18 = fts3SegReaderNextDocid
                           (in_RCX,in_R8,(char **)CONCAT44(iVar3,in_stack_ffffffffffffffb8),
                            (int *)pnOffsetList);
      nSuspect = 1;
      while( true ) {
        bVar2 = false;
        if (((local_18 == 0) && (bVar2 = false, nSuspect < iVar3)) &&
           (bVar2 = false, *(long *)(pnOffsetList[nSuspect] + 0x70) != 0)) {
          bVar2 = *(_func_int_Fts3SegReader_ptr_Fts3SegReader_ptr **)(pnOffsetList[nSuspect] + 0x80)
                  == xCmp_00;
        }
        if (!bVar2) break;
        local_18 = fts3SegReaderNextDocid
                             (in_RCX,in_R8,(char **)CONCAT44(iVar3,in_stack_ffffffffffffffb8),
                              (int *)pnOffsetList);
        nSuspect = nSuspect + 1;
      }
      if (local_18 != 0) goto LAB_00251fa4;
      fts3SegReaderSort(apSegment_00,0,nSuspect,xCmp_00);
      if (-1 < *(int *)(in_RSI + 5)) {
        fts3ColumnFilter((int)in_RCX,(int)((ulong)in_R8 >> 0x20),
                         (char **)CONCAT44(iVar3,in_stack_ffffffffffffffb8),(int *)pnOffsetList);
      }
    }
    (in_RCX->base).pModule = (sqlite3_module *)0x0;
    local_18 = 0;
  }
LAB_00251fa4:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3MsrIncrNext(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pMsr,       /* Multi-segment-reader handle */
  sqlite3_int64 *piDocid,         /* OUT: Docid value */
  char **paPoslist,               /* OUT: Pointer to position list */
  int *pnPoslist                  /* OUT: Size of position list in bytes */
){
  int nMerge = pMsr->nAdvance;
  Fts3SegReader **apSegment = pMsr->apSegment;
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *) = (
    p->bDescIdx ? fts3SegReaderDoclistCmpRev : fts3SegReaderDoclistCmp
  );

  if( nMerge==0 ){
    *paPoslist = 0;
    return SQLITE_OK;
  }

  while( 1 ){
    Fts3SegReader *pSeg;
    pSeg = pMsr->apSegment[0];

    if( pSeg->pOffsetList==0 ){
      *paPoslist = 0;
      break;
    }else{
      int rc;
      char *pList;
      int nList;
      int j;
      sqlite3_int64 iDocid = apSegment[0]->iDocid;

      rc = fts3SegReaderNextDocid(p, apSegment[0], &pList, &nList);
      j = 1;
      while( rc==SQLITE_OK
        && j<nMerge
        && apSegment[j]->pOffsetList
        && apSegment[j]->iDocid==iDocid
      ){
        rc = fts3SegReaderNextDocid(p, apSegment[j], 0, 0);
        j++;
      }
      if( rc!=SQLITE_OK ) return rc;
      fts3SegReaderSort(pMsr->apSegment, nMerge, j, xCmp);

      if( nList>0 && fts3SegReaderIsPending(apSegment[0]) ){
        rc = fts3MsrBufferData(pMsr, pList, (i64)nList+1);
        if( rc!=SQLITE_OK ) return rc;
        assert( (pMsr->aBuffer[nList] & 0xFE)==0x00 );
        pList = pMsr->aBuffer;
      }

      if( pMsr->iColFilter>=0 ){
        fts3ColumnFilter(pMsr->iColFilter, 1, &pList, &nList);
      }

      if( nList>0 ){
        *paPoslist = pList;
        *piDocid = iDocid;
        *pnPoslist = nList;
        break;
      }
    }
  }

  return SQLITE_OK;
}